

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

bool __thiscall luna::Table::SetArrayValue(Table *this,size_t index,Value *value)

{
  size_t sVar1;
  type this_00;
  reference pvVar2;
  anon_union_8_9_8deb4486_for_Value_0 *in_RDX;
  ulong in_RSI;
  Table *in_RDI;
  size_t array_size;
  Value *in_stack_ffffffffffffffc8;
  bool local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    sVar1 = ArraySize(in_RDI);
    if (sVar1 + 1 < in_RSI) {
      local_1 = false;
    }
    else {
      if (in_RSI == sVar1 + 1) {
        AppendAndMergeFromHashToArray(in_RDI,in_stack_ffffffffffffffc8);
      }
      else {
        this_00 = std::
                  unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                  ::operator*((unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                               *)in_RDI);
        pvVar2 = std::vector<luna::Value,_std::allocator<luna::Value>_>::operator[]
                           (this_00,in_RSI - 1);
        pvVar2->field_0 = *in_RDX;
        pvVar2->type_ = *(ValueT *)(in_RDX + 1);
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Table::SetArrayValue(std::size_t index, const Value &value)
    {
        if (index < 1)
            return false;

        std::size_t array_size = ArraySize();
        if (index > array_size + 1)
            return false;

        if (index == array_size + 1)
            AppendAndMergeFromHashToArray(value);
        else
            (*array_)[index - 1] = value;

        return true;
    }